

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_node_copy_utf8(mpack_node_t node,char *buffer,size_t bufsize)

{
  _Bool _Var1;
  mpack_error_t mVar2;
  char *pcVar3;
  mpack_node_data_t *pmVar4;
  mpack_type_t type;
  size_t bufsize_local;
  char *buffer_local;
  mpack_node_t node_local;
  
  pmVar4 = node.data;
  mVar2 = mpack_node_error(node);
  if (mVar2 == mpack_ok) {
    if (pmVar4->type == mpack_type_str) {
      if (bufsize < pmVar4->len) {
        mpack_node_flag_error(node,mpack_error_too_big);
        node_local.tree = (mpack_tree_t *)0x0;
      }
      else {
        pcVar3 = mpack_node_data_unchecked(node);
        _Var1 = mpack_utf8_check(pcVar3,(ulong)pmVar4->len);
        if (_Var1) {
          pcVar3 = mpack_node_data_unchecked(node);
          memcpy(buffer,pcVar3,(ulong)pmVar4->len);
          node_local.tree = (mpack_tree_t *)(ulong)pmVar4->len;
        }
        else {
          mpack_node_flag_error(node,mpack_error_type);
          node_local.tree = (mpack_tree_t *)0x0;
        }
      }
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (size_t)node_local.tree;
}

Assistant:

size_t mpack_node_copy_utf8(mpack_node_t node, char* buffer, size_t bufsize) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    mpack_assert(bufsize == 0 || buffer != NULL, "buffer is NULL for maximum of %i bytes", (int)bufsize);

    mpack_type_t type = node.data->type;
    if (type != mpack_type_str) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    if (node.data->len > bufsize) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return 0;
    }

    if (!mpack_utf8_check(mpack_node_data_unchecked(node), node.data->len)) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    mpack_memcpy(buffer, mpack_node_data_unchecked(node), node.data->len);
    return (size_t)node.data->len;
}